

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O3

Pattern * __thiscall ContextPattern::doAnd(ContextPattern *this,Pattern *b,int4 sa)

{
  int iVar1;
  long lVar2;
  PatternBlock *pPVar3;
  Pattern *pPVar4;
  undefined4 extraout_var;
  
  if (b != (Pattern *)0x0) {
    lVar2 = __dynamic_cast(b,&Pattern::typeinfo,&typeinfo,0);
    if (lVar2 != 0) {
      pPVar3 = PatternBlock::intersect(this->maskvalue,*(PatternBlock **)(lVar2 + 8));
      pPVar4 = (Pattern *)operator_new(0x10);
      pPVar4->_vptr_Pattern = (_func_int **)&PTR__ContextPattern_003ce3c8;
      pPVar4[1]._vptr_Pattern = (_func_int **)pPVar3;
      return pPVar4;
    }
  }
  iVar1 = (*b->_vptr_Pattern[5])(b,this,(ulong)(uint)-sa);
  return (Pattern *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Pattern *ContextPattern::doAnd(const Pattern *b,int4 sa) const

{
  const ContextPattern *b2 = dynamic_cast<const ContextPattern *>(b);
  if (b2 == (const ContextPattern *)0)
    return b->doAnd(this,-sa);

  PatternBlock *resblock = maskvalue->intersect(b2->maskvalue);
  return new ContextPattern(resblock);
}